

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O3

void __thiscall
slang::ast::TypeAliasType::TypeAliasType(TypeAliasType *this,string_view name,SourceLocation loc)

{
  (this->super_Type).super_Symbol.kind = TypeAlias;
  (this->super_Type).super_Symbol.name._M_len = name._M_len;
  (this->super_Type).super_Symbol.name._M_str = name._M_str;
  (this->super_Type).super_Symbol.location = loc;
  (this->super_Type).super_Symbol.originatingSyntax = (SyntaxNode *)0x0;
  (this->super_Type).super_Symbol.parentScope = (Scope *)0x0;
  (this->super_Type).super_Symbol.nextInScope = (Symbol *)0x0;
  (this->super_Type).super_Symbol.indexInScope = 0;
  (this->super_Type).canonical = &this->super_Type;
  DeclaredType::DeclaredType
            (&this->targetType,(Symbol *)this,(bitmask<slang::ast::DeclaredTypeFlags>)0x20);
  this->visibility = Public;
  this->firstForward = (ForwardingTypedefSymbol *)0x0;
  (this->super_Type).canonical = (Type *)0x0;
  return;
}

Assistant:

TypeAliasType::TypeAliasType(std::string_view name, SourceLocation loc) :
    Type(SymbolKind::TypeAlias, name, loc), targetType(*this, DeclaredTypeFlags::TypedefTarget) {
    canonical = nullptr;
}